

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_compilestring(HSQUIRRELVM v)

{
  SQChar *sourcename;
  SQInteger SVar1;
  SQRESULT SVar2;
  HSQUIRRELVM in_RDI;
  HSQUIRRELVM unaff_retaddr;
  SQInteger size;
  SQChar *name;
  SQChar *src;
  SQInteger nargs;
  SQChar **in_stack_ffffffffffffffc8;
  SQInteger in_stack_ffffffffffffffd0;
  char *v_00;
  SQBool raiseerror;
  SQChar *in_stack_fffffffffffffff8;
  
  sourcename = (SQChar *)sq_gettop(in_RDI);
  raiseerror = 0;
  v_00 = "unnamedbuffer";
  sq_getstring((HSQUIRRELVM)"unnamedbuffer",in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SVar1 = sq_getsize((HSQUIRRELVM)v_00,in_stack_ffffffffffffffd0);
  if (2 < (long)sourcename) {
    sq_getstring((HSQUIRRELVM)v_00,SVar1,in_stack_ffffffffffffffc8);
  }
  SVar2 = sq_compilebuffer(unaff_retaddr,in_stack_fffffffffffffff8,(SQInteger)in_RDI,sourcename,
                           raiseerror);
  if (SVar2 < 0) {
    SVar1 = -1;
  }
  else {
    SVar1 = 1;
  }
  return SVar1;
}

Assistant:

static SQInteger base_compilestring(HSQUIRRELVM v)
{
    SQInteger nargs=sq_gettop(v);
    const SQChar *src=NULL,*name=_SC("unnamedbuffer");
    SQInteger size;
    sq_getstring(v,2,&src);
    size=sq_getsize(v,2);
    if(nargs>2){
        sq_getstring(v,3,&name);
    }
    if(SQ_SUCCEEDED(sq_compilebuffer(v,src,size,name,SQFalse)))
        return 1;
    else
        return SQ_ERROR;
}